

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.h
# Opt level: O1

void __thiscall
flow::PassManager::logDebug<std::__cxx11::string>
          (PassManager *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  size_t sVar1;
  PassManager *this_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_string_view<char> format_str;
  string local_268;
  pointer local_248;
  size_type sStack_240;
  undefined **local_238;
  PassManager *local_230;
  long lStack_228;
  ulong local_220;
  PassManager local_218 [21];
  
  sVar1 = strlen(msg);
  local_248 = (args->_M_dataplus)._M_p;
  sStack_240 = args->_M_string_length;
  lStack_228 = 0;
  local_238 = &PTR_grow_00194440;
  local_220 = 500;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_00.types_ = 0xb;
  format_str.size_ = sVar1;
  format_str.data_ = msg;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str,args_00);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,
             (long)&(local_230->handlerPasses_).
                    super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next + lStack_228);
  local_238 = &PTR_grow_00194440;
  this_00 = local_230;
  if (local_230 != local_218) {
    operator_delete(local_230,local_220);
  }
  logDebug(this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void logDebug(const char* msg, Args... args) {
    logDebug(fmt::format(msg, args...));
  }